

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryRegister.cpp
# Opt level: O2

void __thiscall
amrex::BndryRegister::define
          (BndryRegister *this,Orientation _face,IndexType _typ,int _in_rad,int _out_rad,
          int _extent_rad,int _ncomp,DistributionMapping *dmap)

{
  BoxArray local_e0;
  BATransformer local_78;
  
  BATransformer::BATransformer(&local_78,_face,_typ,_in_rad,_out_rad,_extent_rad);
  BoxArray::BoxArray(&local_e0,&this->grids,&local_78);
  FabSet::define(this->bndry + _face.val,&local_e0,dmap,_ncomp);
  FabSet::setVal(this->bndry + _face.val,NAN);
  BoxArray::~BoxArray(&local_e0);
  return;
}

Assistant:

void
BndryRegister::define (Orientation _face,
                       IndexType   _typ,
                       int         _in_rad,
                       int         _out_rad,
                       int         _extent_rad,
                       int         _ncomp,
                       const DistributionMapping& dmap)
{
    BoxArray fsBA(grids, BATransformer(_face,_typ,_in_rad,_out_rad,_extent_rad));

    FabSet& fabs = bndry[_face];

    BL_ASSERT(fabs.size() == 0);

    fabs.define(fsBA,dmap,_ncomp);
    //
    // Go ahead and assign values to the boundary register fabs
    // since in some places APPLYBC (specifically in the tensor
    // operator) the boundary registers are used for a few calculations
    // before the masks are tested to see if you need them.
    //
    fabs.setVal(BL_SAFE_BOGUS);
}